

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void anon_unknown.dwarf_12a29d3::SpeakerDelegate::SDL_audio_callback
               (void *userdata,Uint8 *stream,int len)

{
  const_iterator __first;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)userdata + 0x10))->__data);
  uVar3 = (ulong)(long)len >> 1;
  lVar1 = *(long *)((long)userdata + 0x40) - (long)*(void **)((long)userdata + 0x38);
  uVar2 = lVar1 >> 1;
  uVar4 = uVar3;
  if (uVar2 < uVar3) {
    uVar4 = uVar2;
  }
  memcpy(stream,*(void **)((long)userdata + 0x38),uVar4 * 2);
  if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
    memset(stream + lVar1,0,(uVar3 - uVar2) * 2);
  }
  __first._M_current =
       (((vector<short,_std::allocator<short>_> *)((long)userdata + 0x38))->
       super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data._M_start;
  std::vector<short,_std::allocator<short>_>::erase
            ((vector<short,_std::allocator<short>_> *)((long)userdata + 0x38),__first,
             (const_iterator)(__first._M_current + uVar4));
  pthread_mutex_unlock((pthread_mutex_t *)((long)userdata + 0x10));
  return;
}

Assistant:

static void SDL_audio_callback(void *userdata, Uint8 *stream, int len) {
		reinterpret_cast<SpeakerDelegate *>(userdata)->audio_callback(stream, len);
	}